

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O1

void __thiscall cmDependsC::ParseTransform(cmDependsC *this,string *xform)

{
  long lVar1;
  mapped_type *pmVar2;
  string value;
  string name;
  long *local_58 [2];
  long local_48 [2];
  key_type local_38;
  
  lVar1 = std::__cxx11::string::find((char *)xform,0x4d44e5,0);
  if (1 < lVar1 + 1U) {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)xform);
    std::__cxx11::string::substr((ulong)local_58,(ulong)xform);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->TransformRules,&local_38);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmDependsC::ParseTransform(std::string const& xform)
{
  // A transform rule is of the form SOME_MACRO(%)=value-with-%
  // We can simply separate with "(%)=".
  std::string::size_type pos = xform.find("(%)=");
  if(pos == xform.npos || pos == 0)
    {
    return;
    }
  std::string name = xform.substr(0, pos);
  std::string value = xform.substr(pos+4, xform.npos);
  this->TransformRules[name] = value;
}